

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result.hpp
# Opt level: O1

void __thiscall iutest::TestResult::RecordProperty(TestResult *this,TestProperty *prop)

{
  pointer pTVar1;
  char *__s2;
  int iVar2;
  pointer pTVar3;
  bool bVar4;
  
  pTVar3 = (this->m_test_propertys).
           super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->m_test_propertys).
           super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar4 = pTVar3 == pTVar1;
  if (!bVar4) {
    __s2 = (prop->m_key)._M_dataplus._M_p;
    iVar2 = strcmp((pTVar3->m_key)._M_dataplus._M_p,__s2);
    while (iVar2 != 0) {
      pTVar3 = pTVar3 + 1;
      bVar4 = pTVar3 == pTVar1;
      if (bVar4) goto LAB_001f4dd7;
      iVar2 = strcmp((pTVar3->m_key)._M_dataplus._M_p,__s2);
    }
    std::__cxx11::string::_M_assign((string *)&pTVar3->m_value);
    if (!bVar4) {
      return;
    }
  }
LAB_001f4dd7:
  std::vector<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>::push_back
            (&this->m_test_propertys,prop);
  return;
}

Assistant:

void RecordProperty(const TestProperty& prop)
    {
        for( TestPropertys::iterator it=m_test_propertys.begin()
            , end=m_test_propertys.end(); it != end; ++it )
        {
            if( detail::IsStringEqual(it->key(), prop.key()) )
            {
                it->m_value = prop.m_value;
                return;
            }
        }
        m_test_propertys.push_back(prop);
    }